

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_comm_struct.hpp
# Opt level: O0

void MPIX_NAPDestroy(NAPComm **nap_comm_ptr)

{
  void *pvVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  topo_data *topo_info;
  NAPComm *nap_comm;
  
  pvVar1 = (void *)*in_RDI;
  pvVar2 = *(void **)((long)pvVar1 + 0x38);
  if (pvVar2 != (void *)0x0) {
    topo_data::~topo_data((topo_data *)0x15764e);
    operator_delete(pvVar2);
  }
  if (pvVar1 != (void *)0x0) {
    NAPComm::~NAPComm((NAPComm *)topo_info);
    operator_delete(pvVar1);
  }
  return;
}

Assistant:

static void MPIX_NAPDestroy(NAPComm** nap_comm_ptr)
{
    NAPComm* nap_comm = *nap_comm_ptr;
    topo_data* topo_info = nap_comm->topo_info;
    delete topo_info;
    delete nap_comm;
}